

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC,int *stage_map,int *nstages_active)

{
  uint uVar1;
  sunrealtype ***pppsVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  iVar6 = -0x16;
  if ((MRIC != (MRIStepCoupling)0x0) &&
     (((pppsVar2 = MRIC->W, pppsVar2 != (sunrealtype ***)0x0 || (MRIC->G != (sunrealtype ***)0x0))
      && (nstages_active != (int *)0x0 && stage_map != (int *)0x0)))) {
    *nstages_active = 0;
    iVar5 = 0;
    for (lVar7 = 0; uVar1 = MRIC->stages, lVar7 < (int)uVar1; lVar7 = lVar7 + 1) {
      if (pppsVar2 == (sunrealtype ***)0x0) {
        bVar4 = false;
      }
      else {
        uVar9 = (ulong)(uint)MRIC->nmat;
        if (MRIC->nmat < 1) {
          uVar9 = 0;
        }
        dVar11 = 0.0;
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
            dVar11 = dVar11 + ABS(pppsVar2[uVar10][uVar8][lVar7]);
          }
        }
        bVar4 = 2.220446049250313e-14 < dVar11;
      }
      if (MRIC->G == (sunrealtype ***)0x0) {
        bVar3 = false;
      }
      else {
        uVar9 = (ulong)(uint)MRIC->nmat;
        if (MRIC->nmat < 1) {
          uVar9 = 0;
        }
        dVar11 = 0.0;
        for (uVar10 = 0; uVar10 != uVar9; uVar10 = uVar10 + 1) {
          for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
            dVar11 = dVar11 + ABS(MRIC->G[uVar10][uVar8][lVar7]);
          }
        }
        bVar3 = 2.220446049250313e-14 < dVar11;
      }
      iVar6 = -1;
      if ((bool)(bVar4 | bVar3)) {
        iVar6 = iVar5;
      }
      iVar5 = iVar5 + (uint)(byte)(bVar4 | bVar3);
      stage_map[lVar7] = iVar6;
    }
    iVar6 = -0x16;
    if (iVar5 != 0) {
      *nstages_active = iVar5;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int mriStepCoupling_GetStageMap(MRIStepCoupling MRIC, int* stage_map,
                                int* nstages_active)
{
  int i, j, k, idx;
  sunrealtype Wsum, Gsum;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* ----------------------
   * Check for valid inputs
   * ---------------------- */

  if (!MRIC) { return (ARK_ILL_INPUT); }
  if (!(MRIC->W) && !(MRIC->G)) { return (ARK_ILL_INPUT); }
  if (!stage_map || !nstages_active) { return (ARK_ILL_INPUT); }

  /* -------------------
   * Compute storage map
   * ------------------- */

  /* Number of stage RHS vectors active */
  *nstages_active = 0;

  /* Initial storage index */
  idx = 0;

  /* Check if a stage corresponds to a column of zeros for all coupling
   * matrices by computing the column sums */
  for (j = 0; j < MRIC->stages; j++)
  {
    Wsum = ZERO;
    Gsum = ZERO;

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i < MRIC->stages; i++)
        {
          Wsum += SUNRabs(MRIC->W[k][i][j]);
        }
      }
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        for (i = 0; i < MRIC->stages; i++)
        {
          Gsum += SUNRabs(MRIC->G[k][i][j]);
        }
      }
    }

    if (Wsum > tol || Gsum > tol)
    {
      stage_map[j] = idx;
      idx++;
    }
    else { stage_map[j] = -1; }
  }

  /* Check and set number of stage RHS vectors active */
  if (idx < 1) { return (ARK_ILL_INPUT); }

  *nstages_active = idx;

  return (ARK_SUCCESS);
}